

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Report_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::IO_Report_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IO_Report_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  pointer pKVar3;
  KStringStream ss;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Header7::GetAsString_abi_cxx11_(&local_290,(Header7 *)this);
  poVar2 = std::operator<<(local_1a0,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"-IO Report PDU-");
  IO_Header::GetAsString_abi_cxx11_(&local_1d0,&this->super_IO_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"Simulation Source: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16SimSrc);
  poVar2 = std::operator<<(poVar2,"\nReport Type: ");
  DATA_TYPE::ENUMS::GetEnumAsStringIOReportType_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)this->m_ui8RptTyp,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"\nAttacker ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_AtkEntityID);
  UTILS::IndentString(&local_210,&local_230,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Primary Target ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_270,&this->m_TgtEntityID);
  UTILS::IndentString(&local_250,&local_270,Tabs_00,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Number of standard variable records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumStdVarRec);
  std::operator<<(poVar2,"\nStandard Variables:\n");
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_290);
  pKVar1 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vStdVarRecs).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_290);
    std::operator<<(local_1a0,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString IO_Report_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-IO Report PDU-"
       << IO_Header::GetAsString()
       << "Simulation Source: " << m_ui16SimSrc
       << "\nReport Type: " << GetEnumAsStringIOReportType( m_ui8RptTyp )
       << "\nAttacker ID:\n"
       << IndentString( m_AtkEntityID.GetAsString(), 1 )
       << "Primary Target ID:\n"
       << IndentString( m_TgtEntityID.GetAsString(), 1 )
       << "Number of standard variable records: " << m_ui16NumStdVarRec
       << "\nStandard Variables:\n";

    vector<StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}